

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

void __thiscall
slang::TypedBumpAllocator<slang::analysis::AnalyzedScope>::~TypedBumpAllocator
          (TypedBumpAllocator<slang::analysis::AnalyzedScope> *this)

{
  AnalyzedScope *in_RDI;
  AnalyzedScope *cur;
  Segment *seg;
  CompilationOptions *local_18;
  Compilation *local_10;
  
  for (local_10 = (Compilation *)in_RDI->scope; local_10 != (Compilation *)0x0;
      local_10 = (Compilation *)(local_10->super_BumpAllocator).head) {
    for (local_18 = &local_10->options;
        local_18 != (CompilationOptions *)(local_10->super_BumpAllocator).endPtr;
        local_18 = (CompilationOptions *)&local_18->languageVersion) {
      analysis::AnalyzedScope::~AnalyzedScope(in_RDI);
    }
  }
  BumpAllocator::~BumpAllocator((BumpAllocator *)in_RDI);
  return;
}

Assistant:

~TypedBumpAllocator() {
        Segment* seg = head;
        while (seg) {
            for (T* cur = (T*)(seg + 1); cur != (T*)seg->current; cur++)
                cur->~T();
            seg = seg->prev;
        }
    }